

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall BufferTest_Nonmoveable_Test::TestBody(BufferTest_Nonmoveable_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined8 in_stack_ffffffffffffff48;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined7 in_stack_ffffffffffffff60;
  string local_98 [4];
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  Type in_stack_ffffffffffffff7c;
  AssertHelper *in_stack_ffffffffffffff80;
  AssertionResult local_68;
  string local_58 [8];
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  AssertionResult *in_stack_ffffffffffffffc8;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_18;
  
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0));
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff60));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffd0,(Message *)in_stack_ffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    std::__cxx11::string::~string(local_58);
    testing::Message::~Message((Message *)0x11df3e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11dfb3);
  this_00 = &local_68;
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             SUB81((ulong)this_00 >> 0x38,0));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff60));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffd0,(Message *)in_stack_ffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff50));
    std::__cxx11::string::~string(local_98);
    testing::Message::~Message((Message *)0x11e09a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11e106);
  return;
}

Assistant:

TEST(BufferTest, Nonmoveable) {
  EXPECT_FALSE(std::is_move_constructible<basic_buffer<char> >::value);
#if !FMT_MSC_VER
  // std::is_move_assignable is broken in MSVC2013.
  EXPECT_FALSE(std::is_move_assignable<basic_buffer<char> >::value);
#endif
}